

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O1

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::IPF::get_track_at_position(IPF *this,Address address)

{
  Address this_00;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  uint32_t uVar10;
  iterator iVar11;
  pointer pBVar12;
  ulong uVar13;
  pointer pBVar14;
  pointer pBVar15;
  long lVar16;
  long lVar17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var18;
  pointer pBVar19;
  _Base_ptr __n;
  char *this_01;
  int block;
  _Rb_tree_color _Var20;
  ulong uVar21;
  Address this_02;
  _Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *this_03;
  shared_ptr<Storage::Disk::Track> sVar22;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  pointer local_a0;
  pointer local_98;
  undefined1 local_89;
  Address local_88;
  Time local_80;
  int local_74;
  _Base_ptr local_70;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> local_68;
  DiskImage local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  IPF *local_40;
  key_type local_38;
  
  iVar11 = std::
           _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
           ::find((_Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
                   *)((long)address + 0x100),&local_38);
  if ((iVar11._M_node == (_Base_ptr)((long)address + 0x108)) ||
     (__n = iVar11._M_node[1]._M_parent, __n == (_Base_ptr)0x0)) {
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
    (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)0x0;
    _Var18._M_pi = extraout_RDX;
  }
  else {
    this_00 = (Address)((long)address + 0x10);
    pBVar12 = (pointer)0x0;
    this_01 = (char *)this_00;
    local_88 = address;
    FileHolder::seek((FileHolder *)this_00,(long)__n,0);
    this_02.position.position_ = 0;
    this_02.head = iVar11._M_node[2]._M_color;
    if (this_02 == (Address)0x0) {
      local_98 = (pointer)0x0;
    }
    else {
      this_01 = (char *)this_02;
      pBVar12 = std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_allocate
                          ((_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                           this_02,(size_t)__n);
      local_98 = pBVar12 + (long)this_02;
    }
    local_a0 = pBVar12;
    local_70 = iVar11._M_node;
    local_40 = this;
    if (iVar11._M_node[2]._M_color != _S_red) {
      _Var20 = _S_red;
      do {
        if (pBVar12 == local_98) {
          lVar16 = (long)pBVar12 - (long)local_a0;
          if (lVar16 == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar13 = (lVar16 >> 3) * -0x5555555555555555;
          uVar21 = uVar13;
          if (pBVar12 == local_a0) {
            uVar21 = 1;
          }
          this_03 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                    (uVar21 + uVar13);
          if ((_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)0x555555555555554 <
              this_03) {
            this_03 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                      0x555555555555555;
          }
          if (CARRY8(uVar21,uVar13)) {
            this_03 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                      0x555555555555555;
          }
          pBVar14 = std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::
                    _M_allocate(this_03,(size_t)__n);
          *(undefined8 *)((long)pBVar14 + lVar16) = 0;
          ((undefined8 *)((long)pBVar14 + lVar16))[1] = 0;
          *(undefined8 *)((long)pBVar14 + lVar16 + 0x10) = 0;
          pBVar19 = pBVar14;
          for (pBVar15 = local_a0; pBVar12 != pBVar15; pBVar15 = pBVar15 + 1) {
            uVar10 = pBVar15->data_offset;
            pBVar19->default_gap_value = pBVar15->default_gap_value;
            pBVar19->data_offset = uVar10;
            uVar10 = pBVar15->gap_bits;
            uVar1 = pBVar15->gap_offset;
            bVar2 = pBVar15->is_mfm;
            bVar3 = pBVar15->has_forward_gap;
            bVar4 = pBVar15->has_backwards_gap;
            bVar5 = pBVar15->data_unit_is_bits;
            pBVar19->data_bits = pBVar15->data_bits;
            pBVar19->gap_bits = uVar10;
            pBVar19->gap_offset = uVar1;
            pBVar19->is_mfm = bVar2;
            pBVar19->has_forward_gap = bVar3;
            pBVar19->has_backwards_gap = bVar4;
            pBVar19->data_unit_is_bits = bVar5;
            pBVar19 = pBVar19 + 1;
          }
          if (local_a0 != (pointer)0x0) {
            operator_delete(local_a0,(long)local_98 - (long)local_a0);
          }
          local_98 = pBVar14 + (long)this_03;
          local_a0 = pBVar14;
        }
        else {
          pBVar12->data_bits = 0;
          pBVar12->gap_bits = 0;
          pBVar12->gap_offset = 0;
          pBVar12->is_mfm = false;
          pBVar12->has_forward_gap = false;
          pBVar12->has_backwards_gap = false;
          pBVar12->data_unit_is_bits = false;
          pBVar12->default_gap_value = 0;
          pBVar12->data_offset = 0;
          pBVar19 = pBVar12;
        }
        uVar10 = FileHolder::get32be((FileHolder *)this_00);
        pBVar19->data_bits = uVar10;
        uVar10 = FileHolder::get32be((FileHolder *)this_00);
        pBVar19->gap_bits = uVar10;
        __n = (_Base_ptr)0x8;
        if (*(char *)((long)local_88 + 0x130) == '\x01') {
          uVar10 = FileHolder::get32be((FileHolder *)this_00);
          pBVar19->gap_offset = uVar10;
          __n = (_Base_ptr)0x4;
        }
        FileHolder::seek((FileHolder *)this_00,(long)__n,1);
        uVar10 = FileHolder::get32be((FileHolder *)this_00);
        pBVar19->is_mfm = uVar10 == 1;
        uVar10 = FileHolder::get32be((FileHolder *)this_00);
        bVar7 = (byte)uVar10;
        pBVar19->has_forward_gap = (bool)(bVar7 & 1);
        pBVar19->has_backwards_gap = (bool)(bVar7 >> 1 & 1);
        pBVar19->data_unit_is_bits = (bool)(bVar7 >> 2 & 1);
        uVar10 = FileHolder::get32be((FileHolder *)this_00);
        pBVar19->default_gap_value = uVar10;
        this_01 = (char *)this_00;
        uVar10 = FileHolder::get32be((FileHolder *)this_00);
        pBVar19->data_offset = uVar10;
        pBVar12 = pBVar19 + 1;
        _Var20 = _Var20 + _S_black;
      } while (_Var20 < local_70[2]._M_color);
    }
    local_68.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_a0 != pBVar12) {
      block = 0;
      pBVar19 = local_a0;
      do {
        p_Var6 = local_70;
        local_80 = bit_length((IPF *)this_01,*(Density *)&local_70[1]._M_left,block);
        local_74 = block;
        if ((ulong)pBVar19->gap_offset == 0) {
          if ((ulong)pBVar19->gap_bits != 0) {
            add_gap((IPF *)this_01,&local_68,local_80,(ulong)pBVar19->gap_bits,
                    pBVar19->default_gap_value);
          }
        }
        else {
          FileHolder::seek((FileHolder *)this_00,
                           (long)&(p_Var6[1]._M_parent)->_M_color + (ulong)pBVar19->gap_offset,0);
          do {
            this_01 = (char *)this_00;
            bVar7 = FileHolder::get8((FileHolder *)this_00);
            if (bVar7 == 0) break;
            if (bVar7 < 0x20) {
              uVar21 = 0;
            }
            else {
              bVar9 = bVar7 >> 5;
              uVar21 = 0;
              do {
                bVar8 = FileHolder::get8((FileHolder *)this_00);
                uVar21 = uVar21 << 8 | (ulong)bVar8;
                bVar9 = bVar9 - 1;
              } while (bVar9 != 0);
            }
            if ((bVar7 & 0x1f) == 1) {
              this_01 = "Adding gap length %zu bits\n";
              printf("Adding gap length %zu bits\n",uVar21);
              add_gap((IPF *)this_01,&local_68,local_80,uVar21,pBVar19->default_gap_value);
            }
            else {
              printf("Adding sampled gap length %zu bits\n",uVar21);
              this_01 = (char *)local_88;
              add_raw_data((IPF *)local_88,&local_68,local_80,uVar21);
            }
            block = local_74;
          } while (bVar7 != 0);
        }
        if ((ulong)pBVar19->data_offset != 0) {
          FileHolder::seek((FileHolder *)this_00,
                           (long)&(local_70[1]._M_parent)->_M_color + (ulong)pBVar19->data_offset,0)
          ;
          do {
            this_01 = (char *)this_00;
            bVar7 = FileHolder::get8((FileHolder *)this_00);
            if (bVar7 == 0) break;
            if (bVar7 < 0x20) {
              uVar21 = 0;
            }
            else {
              bVar9 = bVar7 >> 5;
              uVar21 = 0;
              do {
                bVar8 = FileHolder::get8((FileHolder *)this_00);
                uVar21 = uVar21 << 8 | (ulong)bVar8;
                bVar9 = bVar9 - 1;
              } while (bVar9 != 0);
            }
            uVar21 = uVar21 << (pBVar19->data_unit_is_bits == false) * '\x03';
            lVar16 = FileHolder::tell((FileHolder *)this_00);
            bVar9 = bVar7 & 0x1f;
            if (bVar9 - 2 < 2) {
              add_unencoded_data((IPF *)local_88,&local_68,local_80,uVar21);
            }
            else if ((bVar9 == 1) || (bVar9 == 4)) {
              add_raw_data((IPF *)local_88,&local_68,local_80,uVar21);
            }
            else {
              printf("Unhandled data type %d, length %zu bits\n",(ulong)bVar9,uVar21);
            }
            this_01 = (char *)this_00;
            lVar17 = FileHolder::tell((FileHolder *)this_00);
            if (lVar17 != (uVar21 >> 3) + lVar16) {
              __assert_fail("file_.tell() == next_chunk",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                            ,0x135,
                            "virtual std::shared_ptr<Track> Storage::Disk::IPF::get_track_at_position(Track::Address)"
                           );
            }
            block = local_74;
          } while (bVar7 != 0);
        }
        block = block + 1;
        pBVar19 = pBVar19 + 1;
      } while (pBVar19 != pBVar12);
    }
    local_50._vptr_DiskImage = (_func_int **)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
              (&local_48,(PCMTrack **)&local_50,(allocator<Storage::Disk::PCMTrack> *)&local_89,
               &local_68);
    this = local_40;
    _Var18._M_pi = local_48._M_pi;
    (local_40->super_DiskImage)._vptr_DiskImage = local_50._vptr_DiskImage;
    (local_40->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)0x0;
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_40->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)_Var18._M_pi;
    std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
              (&local_68);
    _Var18._M_pi = extraout_RDX_00;
    if (local_a0 != (pointer)0x0) {
      operator_delete(local_a0,(long)local_98 - (long)local_a0);
      _Var18._M_pi = extraout_RDX_01;
    }
  }
  sVar22.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var18._M_pi;
  sVar22.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar22.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> IPF::get_track_at_position([[maybe_unused]] Track::Address address) {
	// Get the track description, if it exists, and check either that the file has contents for the track.
	auto pair = tracks_.find(address);
	if(pair == tracks_.end()) {
		return nullptr;
	}
	const TrackDescription &description = pair->second;
	if(!description.file_offset) {
		return nullptr;
	}

	// Seek to track content.
	file_.seek(description.file_offset, SEEK_SET);

	// Read the block descriptions up front.
	//
	// This is less efficient than just seeking for each block in turn,
	// but is a useful crutch to comprehension of the file format on a
	// first run through.
	struct BlockDescriptor {
		uint32_t data_bits = 0;
		uint32_t gap_bits = 0;
		uint32_t gap_offset = 0;
		bool is_mfm = false;
		bool has_forward_gap = false;
		bool has_backwards_gap = false;
		bool data_unit_is_bits = false;
		uint32_t default_gap_value = 0;
		uint32_t data_offset = 0;
	};
	std::vector<BlockDescriptor> blocks;
	blocks.reserve(description.block_count);
	for(uint32_t c = 0; c < description.block_count; c++) {
		auto &block = blocks.emplace_back();
		block.data_bits = file_.get32be();
		block.gap_bits = file_.get32be();
		if(is_sps_format_) {
			block.gap_offset = file_.get32be();
			file_.seek(4, SEEK_CUR);	// Skip 'cell type' which appears to provide no content.
		} else {
			// Skip potlower-resolution copies of data_bits and gap_bits.
			file_.seek(8, SEEK_CUR);
		}
		block.is_mfm = file_.get32be() == 1;

		const uint32_t flags = file_.get32be();
		block.has_forward_gap = flags & 1;
		block.has_backwards_gap = flags & 2;
		block.data_unit_is_bits = flags & 4;

		block.default_gap_value = file_.get32be();
		block.data_offset = file_.get32be();
	}

	std::vector<Storage::Disk::PCMSegment> segments;
	int block_count = 0;
	for(auto &block: blocks) {
		const auto length_of_a_bit = bit_length(description.density, block_count);

		if(block.gap_offset) {
			file_.seek(description.file_offset + block.gap_offset, SEEK_SET);
			while(true) {
				const uint8_t gap_header = file_.get8();
				if(!gap_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, GapLength, SampleLength
				} type = Type(gap_header & 0x1f);
				const size_t length = block_size(file_, gap_header);

				switch(type) {
					case Type::GapLength:
						printf("Adding gap length %zu bits\n", length);
						add_gap(segments, length_of_a_bit, length, block.default_gap_value);
					break;

					default:
					case Type::SampleLength:
						printf("Adding sampled gap length %zu bits\n", length);
						add_raw_data(segments, length_of_a_bit, length);
//						file_.seek(long(length >> 3), SEEK_CUR);
					break;
				}
			}
		} else if(block.gap_bits) {
			add_gap(segments, length_of_a_bit, block.gap_bits, block.default_gap_value);
		}

		if(block.data_offset) {
			file_.seek(description.file_offset + block.data_offset, SEEK_SET);
			while(true) {
				const uint8_t data_header = file_.get8();
				if(!data_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, Sync, Data, Gap, Raw, Fuzzy
				} type = Type(data_header & 0x1f);
				const size_t length = block_size(file_, data_header) * (block.data_unit_is_bits ? 1 : 8);
#ifndef NDEBUG
				const auto next_chunk = file_.tell() + long(length >> 3);
#endif

				switch(type) {
					case Type::Gap:
					case Type::Data:
						add_unencoded_data(segments, length_of_a_bit, length);
					break;

					case Type::Sync:
					case Type::Raw:
						add_raw_data(segments, length_of_a_bit, length);
					break;

					default:
						printf("Unhandled data type %d, length %zu bits\n", int(type), length);
					break;
				}

				assert(file_.tell() == next_chunk);
			}
		}

		++block_count;
	}

	return std::make_shared<Storage::Disk::PCMTrack>(segments);
}